

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettify.h
# Opt level: O0

size_t floaxie::fill_exponent<char>(uint K,char *buffer)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  char *d;
  uchar hundreds;
  char *buffer_local;
  uint K_local;
  
  cVar1 = (char)((ulong)K / 100);
  *buffer = cVar1 + '0';
  pcVar2 = buffer + (int)(uint)(cVar1 != '\0');
  uVar3 = (ulong)(K % 100 << 1);
  *pcVar2 = digits_lut[uVar3];
  pcVar2[1] = digits_lut[uVar3 + 1];
  pcVar2[2] = '\0';
  return (long)(int)((cVar1 != '\0') + 2);
}

Assistant:

inline std::size_t fill_exponent(unsigned int K, CharType* buffer) noexcept
	{
		const unsigned char hundreds = static_cast<unsigned char>(K / 100);
		K %= 100;
		buffer[0] = '0' + hundreds;
		buffer += (hundreds > 0);

		const char* d = digits_lut + K * 2;
		buffer[0] = d[0];
		buffer[1] = d[1];

		buffer[2] = '\0';

		return 2 + (hundreds > 0);
	}